

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::FixStorageClass::ChangeResultType
          (FixStorageClass *this,Instruction *inst,uint32_t new_type_id)

{
  uint32_t uVar1;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  uVar1 = 0;
  if (inst->has_type_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(inst,0);
  }
  if (uVar1 != new_type_id) {
    IRContext::ForgetUses((this->super_Pass).context_,inst);
    if (inst->has_type_id_ == false) {
      __assert_fail("has_type_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    if (new_type_id == 0) {
      __assert_fail("ty_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    local_58._24_8_ = local_58 + 0x10;
    local_58._0_8_ = &PTR__SmallVector_00b15d78;
    local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_58._8_8_ = 1;
    local_58._16_4_ = new_type_id;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&((inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->words,
               (SmallVector<unsigned_int,_2UL> *)local_58);
    local_58._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_38,local_38._M_head_impl);
    }
    IRContext::AnalyzeUses((this->super_Pass).context_,inst);
  }
  return uVar1 != new_type_id;
}

Assistant:

bool FixStorageClass::ChangeResultType(Instruction* inst,
                                       uint32_t new_type_id) {
  if (inst->type_id() == new_type_id) {
    return false;
  }

  context()->ForgetUses(inst);
  inst->SetResultType(new_type_id);
  context()->AnalyzeUses(inst);
  return true;
}